

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void operator_delete(void *p)

{
  code *pcVar1;
  bool bVar2;
  MetaEntryBase *this;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *pcVar3;
  alloc_id_t target_id;
  size_t sVar4;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  in_RDI;
  undefined8 *in_FS_OFFSET;
  PagemapEntry *entry;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  p_tame;
  AllocWild<void> p_wild;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  bool result;
  int64_t size;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  size_t in_stack_fffffffffffffb68;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *p_00;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffb70;
  LocalEntropy *in_stack_fffffffffffffb80;
  Alloc<void> AVar5;
  address_t in_stack_fffffffffffffb88;
  Alloc<RemoteMessage> msg;
  sizeclass_t in_stack_fffffffffffffb90;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_00;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *pTVar6;
  sizeclass_t sc;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffbb8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *in_stack_fffffffffffffbc0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_420;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_418;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_408;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_400;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_3f0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_3e8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_3e0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_3d8;
  size_t local_3d0;
  ulong local_3c8;
  MetaEntryBase *local_3c0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3b8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_3b0;
  char *local_3a8;
  undefined1 local_399;
  char **local_398;
  MetaEntryBase *local_390;
  MetaEntryBase *local_388;
  ulong local_380;
  ulong local_378;
  MetaEntryBase *local_370;
  ulong local_368;
  MetaEntryBase *local_360;
  size_t local_358;
  MetaEntryBase *local_350;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_348;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_340;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_338;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_330;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_328;
  ulong local_318;
  ulong local_310;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_300;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_2f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_2f0;
  undefined1 local_2e8 [8];
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_2e0;
  undefined1 *local_2d8;
  LocalState *local_2c0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_2b8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_2b0;
  LocalState **local_2a8;
  undefined1 local_298 [16];
  undefined1 *local_288;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_280;
  undefined8 local_278;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_270;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_268;
  MetaEntryBase *local_260;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_258;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_250;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_248;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_240;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_238;
  char *local_230;
  byte local_221;
  char **local_220;
  undefined8 *local_218;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_210;
  undefined8 local_208;
  undefined8 *local_200;
  MetaEntryBase *local_1f8;
  undefined1 local_1e9;
  size_t local_1e8;
  long local_1e0;
  undefined2 local_1d2;
  MetaEntryBase *local_1d0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1c8;
  ulong local_1c0;
  MetaEntryBase *local_1b8;
  size_t local_1b0;
  MetaEntryBase *local_1a8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_1a0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_170;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_168;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_160;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_158;
  MetaEntryBase *local_150;
  MetaEntryBase *local_148;
  ulong local_140;
  MetaEntryBase *local_138;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_130;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_128;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_120;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_118;
  LocalEntropy *local_110;
  ulong local_108;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_100;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_f8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_f0;
  char *local_e8;
  undefined1 local_d9;
  char **local_d8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  SingletonRemoteMessage *local_c8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_c0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_b8
  ;
  LocalEntropy *local_b0;
  ulong local_a8;
  undefined1 *local_a0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_98;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_90;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_88;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_80;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_78;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_70;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_68;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_60;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_58;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_50;
  undefined1 local_48 [8];
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_40;
  undefined1 *local_38;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_30;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_28
  ;
  ulong local_20;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_18
  ;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_10;
  LocalEntropy **local_8;
  
  msg.unsafe_capptr = *(SingletonRemoteMessage **)*in_FS_OFFSET;
  local_178 = local_188;
  pTVar6 = in_RDI.unsafe_capptr;
  sc.value = (size_t)in_RDI.unsafe_capptr;
  local_418 = in_RDI.unsafe_capptr;
  local_408 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              msg.unsafe_capptr;
  local_2c0 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              backend_state_ptr((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                                 *)msg.unsafe_capptr);
  local_2b8 = local_418;
  local_2a8 = &local_2c0;
  local_170 = &local_2b8;
  local_288 = local_298;
  local_2b0 = local_418;
  local_420 = local_418;
  local_330 = local_418;
  local_328 = &local_330;
  this = (MetaEntryBase *)
         snmalloc::
         FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
         ::get<false>(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  pcVar3 = snmalloc::
           Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
           public_state((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                         *)msg.unsafe_capptr);
  local_378 = this->remote_and_sizeclass;
  local_390 = this;
  local_370 = this;
  if (pcVar3 == (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
                (local_378 & 0xffffffffffffff80)) {
    local_400 = &local_420;
    local_280 = local_420;
    local_158 = &local_280;
    local_3b0 = local_420;
    local_3c8 = this->meta & 0xfffffffffffffffe;
    this_00 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              msg.unsafe_capptr;
    AVar5.unsafe_capptr = local_420;
    local_3c0 = this;
    local_3b8 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)msg.unsafe_capptr;
    local_388 = this;
    local_368 = local_3c8;
    local_360 = this;
    local_350 = this;
    local_3d0 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffb68);
    local_3d8 = local_3b0;
    local_348 = local_3b0;
    local_340 = &local_348;
    local_338 = local_3b0;
    local_358 = local_3d0;
    local_399 = snmalloc::is_start_of_object(sc,(address_t)pTVar6);
    local_3a8 = "Not deallocating start of an object";
    if (((local_399 ^ 0xff) & 1) != 0) {
      local_398 = &local_3a8;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_300 = &local_3b0;
    local_2f0 = local_3b0;
    local_2d8 = local_2e8;
    local_2f8 = local_3b0;
    local_3e0 = local_3b0;
    local_3e8 = local_3b0;
    local_380 = local_3c8;
    local_310 = local_3c8;
    local_318 = local_3c8;
    local_2e0 = local_2f0;
    snmalloc::freelist::
    Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add((Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           *)this_00,in_RDI,(FreeListKey *)msg.unsafe_capptr,in_stack_fffffffffffffb88,
          in_stack_fffffffffffffb80);
    bVar2 = snmalloc::
            FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                             *)0x1427ac);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_3f0 = local_3b0;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow
                (in_stack_fffffffffffffbb8,AVar5,(PagemapEntry *)sc.value,
                 (BackendSlabMetadata *)pTVar6);
    }
  }
  else {
    local_250 = local_420;
    local_140 = this->remote_and_sizeclass;
    local_260 = this;
    local_258 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)msg.unsafe_capptr;
    local_150 = this;
    local_148 = this;
    local_138 = this;
    if ((local_140 & 0xffffffffffffff80) == 0) {
      local_200 = &local_278;
      local_208 = 0;
      local_278 = 0;
      local_210 = &local_250;
      local_218 = &local_278;
      if (local_420 !=
          (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           *)0x0) {
        local_240 = &local_250;
        local_1a0 = local_420;
        local_160 = &local_1a0;
        local_248 = &local_250;
        local_f0 = local_420;
        local_d9 = local_420 ==
                   (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                    *)0x0;
        local_e8 = "Not allocated by snmalloc.";
        if (!(bool)local_d9) {
          local_d8 = &local_e8;
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
    else {
      local_238 = &local_250;
      local_198[0] = local_420;
      local_168 = local_198;
      pTVar6 = local_420;
      bVar2 = snmalloc::MetaEntryBase::is_backend_owned(this);
      local_221 = (bVar2 ^ 0xffU) & 1;
      local_230 = "Memory corruption detected";
      if (((local_221 ^ 0xff) & 1) != 0) {
        local_220 = &local_230;
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      AVar5.unsafe_capptr =
           &((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
            msg.unsafe_capptr)->remote_dealloc_cache;
      local_1d0 = local_260;
      local_1d2 = 1;
      target_id = 1;
      local_1b8 = local_260;
      local_1a8 = local_260;
      local_1c8 = (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   *)AVar5.unsafe_capptr;
      local_1e8 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffb68);
      local_1b0 = local_1e8;
      sVar4 = snmalloc::sizeclass_full_to_size(in_stack_fffffffffffffb90);
      local_1e0 = target_id * sVar4;
      local_1e9 = local_1e0 < *(long *)((long)AVar5.unsafe_capptr + 0x1808);
      if ((bool)local_1e9) {
        *(long *)((long)AVar5.unsafe_capptr + 0x1808) =
             *(long *)((long)AVar5.unsafe_capptr + 0x1808) - local_1e0;
        p_00 = &((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                  *)msg.unsafe_capptr)->remote_dealloc_cache;
        local_1f8 = local_260;
        local_1c0 = local_260->meta & 0xfffffffffffffffe;
        local_268 = local_250;
        local_110 = &((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                       *)msg.unsafe_capptr)->entropy;
        local_f8 = local_250;
        local_120 = local_250;
        local_108 = local_1c0;
        local_100 = p_00;
        local_128 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)snmalloc::freelist::Object::
                       make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                 ((CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                   )AVar5.unsafe_capptr);
        local_a0 = &p_00->field_0x1800;
        local_a8 = local_108;
        local_b0 = local_110;
        local_8 = &local_b0;
        local_80 = &local_88;
        local_130 = p_00;
        local_118 = local_128;
        local_c0 = local_128;
        local_98 = p_00;
        local_90 = local_128;
        local_88 = local_128;
        local_78 = local_128;
        local_30 = local_128;
        local_10 = local_128;
        local_b8 = snmalloc::
                   FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                   ::get<false>(in_stack_fffffffffffffb70,(address_t)p_00);
        local_20 = (local_b8->
                   super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                   ).super_MetaEntryBase.remote_and_sizeclass;
        local_28 = local_b8;
        local_18 = local_b8;
        snmalloc::RemoteAllocator::trunc_id((RemoteAllocator *)(local_20 & 0xffffffffffffff80));
        local_70 = &local_90;
        local_50 = local_90;
        local_38 = local_48;
        local_58 = local_90;
        local_68 = local_90;
        local_d0 = local_90;
        local_60 = local_70;
        local_40 = local_50;
        local_c8 = (SingletonRemoteMessage *)
                   snmalloc::SingletonRemoteMessage::emplace_in_alloc(AVar5);
        snmalloc::
        RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)AVar5.unsafe_capptr,target_id,msg);
      }
      else {
        local_270 = local_250;
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>
                  (in_stack_fffffffffffffbc0,(PagemapEntry *)pTVar6,(Alloc<void>)local_418);
      }
    }
  }
  return;
}

Assistant:

void operator delete(void* p) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}